

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteObject(ON_BinaryArchive *this,ON_Object *o)

{
  bool bVar1;
  bool local_19;
  bool rc;
  ON_Object *o_local;
  ON_BinaryArchive *this_local;
  
  if (o == (ON_Object *)0x0) {
    local_19 = BeginWrite3dmChunk(this,0x27ffa,0);
    if (local_19) {
      local_19 = BeginWrite3dmChunk(this,0x2fffb,0);
      if (local_19) {
        local_19 = WriteUuid(this,&ON_nil_uuid);
        bVar1 = EndWrite3dmChunk(this);
        if (!bVar1) {
          local_19 = false;
        }
      }
      bVar1 = EndWrite3dmChunk(this);
      if (!bVar1) {
        local_19 = false;
      }
    }
  }
  else {
    local_19 = WriteObject(this,o);
  }
  return local_19;
}

Assistant:

bool
ON_BinaryArchive::WriteObject( const ON_Object* o )
{
  bool rc = false;
  if ( o )
    rc = WriteObject(*o);
  else {
    // nullptr object has nil UUID and no date
    rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS, 0 );
    if (rc) {
      rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_UUID, 0 );
      if ( rc ) {
        rc = WriteUuid( ON_nil_uuid );
        if ( !EndWrite3dmChunk() ) // end of TCODE_OPENNURBS_CLASS_UUID chunk
          rc = false;
      }
      if ( !EndWrite3dmChunk() )
        rc = false;
    }
  }
  return rc;
}